

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

bool __thiscall smf::MidiMessage::isTempo(MidiMessage *this)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  MidiMessage *this_local;
  
  bVar1 = isMetaMessage(this);
  if (bVar1) {
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
    if (*pvVar2 == 'Q') {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
      if (sVar3 == 6) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MidiMessage::isTempo(void) const {
	if (!isMetaMessage()) {
		return false;
	} else if ((*this)[1] != 0x51) {
		return false;
	} else if (size() != 6) {
		// Meta tempo message can only be 6 bytes long.
		return false;
	} else {
		return true;
	}
}